

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::Table_IterationOrderChangesByInstance_Test::TestBody
          (Table_IterationOrderChangesByInstance_Test *this)

{
  pointer *__return_storage_ptr__;
  const_iterator piVar1;
  reference t;
  Message *pMVar2;
  bool bVar3;
  AssertHelper local_120;
  Message local_118;
  vector<int,_std::allocator<int>_> local_110;
  IntTable local_f8;
  int local_c8;
  byte local_c1;
  int i;
  bool found_difference;
  vector<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
  tables;
  undefined1 local_98 [8];
  vector<int,_std::allocator<int>_> reference;
  IntTable reference_table;
  size_t size;
  const_iterator __end2;
  const_iterator __begin2;
  undefined4 local_30;
  undefined4 local_2c;
  initializer_list<int> local_28;
  initializer_list<int> *local_18;
  initializer_list<int> *__range2;
  Table_IterationOrderChangesByInstance_Test *this_local;
  
  __begin2._0_4_ = 2;
  __begin2._4_4_ = 6;
  local_30 = 0xc;
  local_2c = 0x14;
  local_28._M_array = (iterator)&__begin2;
  local_28._M_len = 4;
  local_18 = &local_28;
  __range2 = (initializer_list<int> *)this;
  __end2 = std::initializer_list<int>::begin(local_18);
  piVar1 = std::initializer_list<int>::end(local_18);
  while( true ) {
    if (__end2 == piVar1) {
      return;
    }
    reference_table.
    super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
    .settings_.
    super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
    .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
         (_Tuple_impl<0UL,_unsigned_long,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
          )(long)*__end2;
    __return_storage_ptr__ =
         &reference.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage;
    MakeSimpleTable((IntTable *)__return_storage_ptr__,
                    (size_t)reference_table.
                            super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                            .settings_.
                            super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                            .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl);
    OrderOfIteration((vector<int,_std::allocator<int>_> *)local_98,
                     (IntTable *)__return_storage_ptr__);
    std::
    vector<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
    ::vector((vector<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
              *)&i);
    local_c1 = 0;
    for (local_c8 = 0; (local_c1 & 1) == 0 && local_c8 < 5000; local_c8 = local_c8 + 1) {
      MakeSimpleTable(&local_f8,
                      (size_t)reference_table.
                              super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                              .settings_.
                              super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                              .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl);
      std::
      vector<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
      ::push_back((vector<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
                   *)&i,&local_f8);
      IntTable::~IntTable(&local_f8);
      t = std::
          vector<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
          ::back((vector<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
                  *)&i);
      OrderOfIteration(&local_110,t);
      local_c1 = std::operator!=(&local_110,(vector<int,_std::allocator<int>_> *)local_98);
      std::vector<int,_std::allocator<int>_>::~vector(&local_110);
    }
    bVar3 = (local_c1 & 1) == 0;
    if (bVar3) {
      testing::Message::Message(&local_118);
      pMVar2 = testing::Message::operator<<
                         (&local_118,
                          (char (*) [66])
                          "Iteration order remained the same across many attempts with size ");
      pMVar2 = testing::Message::operator<<
                         (pMVar2,(unsigned_long *)
                                 &reference_table.
                                  super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                                  .settings_);
      testing::internal::AssertHelper::AssertHelper
                (&local_120,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
                 ,0x709,"Failed");
      testing::internal::AssertHelper::operator=(&local_120,pMVar2);
      testing::internal::AssertHelper::~AssertHelper(&local_120);
      testing::Message::~Message(&local_118);
    }
    std::
    vector<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
    ::~vector((vector<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
               *)&i);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_98);
    IntTable::~IntTable((IntTable *)
                        &reference.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    if (bVar3) break;
    __end2 = __end2 + 1;
  }
  return;
}

Assistant:

TEST(Table, IterationOrderChangesByInstance) {
  for (size_t size : {2, 6, 12, 20}) {
    const auto reference_table = MakeSimpleTable(size);
    const auto reference = OrderOfIteration(reference_table);

    std::vector<IntTable> tables;
    bool found_difference = false;
    for (int i = 0; !found_difference && i < 5000; ++i) {
      tables.push_back(MakeSimpleTable(size));
      found_difference = OrderOfIteration(tables.back()) != reference;
    }
    if (!found_difference) {
      FAIL()
          << "Iteration order remained the same across many attempts with size "
          << size;
    }
  }
}